

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Runtime::LogBytecode(Runtime *this,Parser *parser)

{
  uint8_t uVar1;
  uint32_t uVar2;
  _Alloc_hider _Var3;
  ValueType valueType;
  char *pcVar4;
  size_t sVar5;
  RuntimeID id_00;
  long lVar6;
  uint uVar7;
  uint8_t opByte;
  uint32_t subscripts;
  Parser *local_530;
  RuntimeID id;
  ValueType type;
  BinaryReader reader;
  BufferPtr buffer;
  BytecodeHeader header;
  String scriptName;
  __shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2> local_4a8;
  uint32_t count;
  undefined1 local_490 [1016];
  FunctionSignature *local_98;
  RuntimeID local_88;
  VisibilityType local_80;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  local_68;
  _Tp_alloc_type local_58;
  pointer local_50;
  pointer pFStack_48;
  pointer local_40;
  
  LogWriteLine(Info,"\nBytecode:\n====================");
  local_530 = parser;
  std::__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>,
             &(parser->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4a8,&buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  BinaryReader::BinaryReader(&reader,(BufferPtr *)&local_4a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4a8._M_refcount);
  header.signature = 0x584e494a;
  header.version = 1;
  header.dataSize = 0;
  BinaryReader::Read(&reader,&header,0xc);
  scriptName._M_dataplus._M_p = (pointer)&scriptName.field_2;
  scriptName._M_string_length = 0;
  scriptName.field_2._M_local_buf[0] = '\0';
  BinaryReader::Read(&reader,&scriptName);
  uVar7 = 0;
  do {
    if ((ulong)header.dataSize + 0xc <= reader.m_pos) {
      LogWrite(Info,"\nInstruction Count: %i\n\n",(ulong)uVar7);
LAB_001070c3:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&scriptName);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&reader.m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    BinaryReader::Read(&reader,&opByte);
    uVar1 = opByte;
    if (Wait < opByte) {
      LogWriteLine(Error,"LogBytecode(): Invalid operation in bytecode");
      goto LAB_001070c3;
    }
    pcVar4 = GetOpcodeText((uint)opByte);
    sVar5 = strlen(pcVar4);
    LogWrite(Info,pcVar4);
    if (0xf < sVar5) {
      __assert_fail("opcodeNameLength < columnWidth",
                    "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxRuntime.cpp"
                    ,0xd5,"void Jinx::Impl::Runtime::LogBytecode(const Parser &) const");
    }
    uVar7 = uVar7 + 1;
    for (lVar6 = sVar5 - 0x10; lVar6 != 0; lVar6 = lVar6 + 1) {
      LogWrite(Info," ");
    }
    switch(uVar1) {
    case '\x02':
    case '\a':
    case '&':
    case '(':
    case '.':
    case '0':
      BinaryReader::Read(&reader,&id);
      Parser::GetNameFromID_abi_cxx11_((String *)&count,local_530,id);
      LogWrite(Info,"%s",_count);
      goto LAB_00106ef1;
    case '\x03':
      BinaryReader::Read(&reader,(uint8_t *)&count);
      valueType = ByteToValueType((uint8_t)count);
      pcVar4 = GetValueTypeName(valueType);
      LogWrite(Info,"%s",pcVar4);
      break;
    case '\b':
    case '\t':
    case '/':
    case '1':
      BinaryReader::Read(&reader,&subscripts);
      BinaryReader::Read(&reader,&id);
      uVar2 = subscripts;
      Parser::GetNameFromID_abi_cxx11_((String *)&count,local_530,id);
      pcVar4 = "subscripts";
      if (uVar2 == 1) {
        pcVar4 = "subscript";
      }
      LogWrite(Info,"%i %s, %s",(ulong)uVar2,pcVar4,_count);
      goto LAB_00106ef1;
    case '\v':
      local_98 = (FunctionSignature *)&count;
      local_88 = 0;
      local_80 = Local;
      local_78._M_p = (pointer)&local_68;
      local_70 = 0;
      local_68._M_local_buf[0] = '\0';
      local_50 = (pointer)0x0;
      pFStack_48 = (pointer)0x0;
      local_40 = (pointer)0x0;
      local_58.m_arena = (arena_type *)local_98;
      FunctionSignature::Read(local_98,&reader);
      Parser::GetNameFromID_abi_cxx11_((String *)&id,local_530,local_88);
      LogWrite(Info,"%s",id);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&id);
      FunctionSignature::~FunctionSignature((FunctionSignature *)&count);
      break;
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
    case '\x13':
    case ' ':
    case '\"':
    case '%':
      BinaryReader::Read(&reader,&count);
      LogWrite(Info,"%i",(ulong)_count & 0xffffffff);
      break;
    case '\x16':
      _count = local_490 + 8;
      local_490._0_8_ = 0.0;
      local_490[8] = '\0';
      BinaryReader::Read(&reader,(String *)&count);
      LogWrite(Info,"%s",_count);
      goto LAB_00106ef1;
    case '!':
      PropertyName::PropertyName((PropertyName *)&count);
      PropertyName::Read((PropertyName *)&count,&reader);
      PropertyName::~PropertyName((PropertyName *)&count);
      break;
    case ')':
      _count = _count & 0xffffffff00000000;
      Variant::Read((Variant *)&count,&reader);
      if (count == 7) {
        id_00 = Variant::GetFunction((Variant *)&count);
        Parser::GetNameFromID_abi_cxx11_((String *)&id,local_530,id_00);
        LogWrite(Info,"%s",id);
      }
      else if (count == 4) {
        Variant::GetString_abi_cxx11_((String *)&id,(Variant *)&count);
        LogWrite(Info,"\"%s\"",id);
      }
      else {
        Variant::GetString_abi_cxx11_((String *)&id,(Variant *)&count);
        LogWrite(Info,"%s",id);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&id);
      Variant::~Variant((Variant *)&count);
      break;
    case '-':
      BinaryReader::Read(&reader,&id);
      BinaryReader::Read(&reader,(int32_t *)&subscripts);
      BinaryReader::Read<Jinx::ValueType,unsigned_char>(&reader,&type);
      Parser::GetNameFromID_abi_cxx11_((String *)&count,local_530,id);
      _Var3._M_p = _count;
      uVar2 = subscripts;
      pcVar4 = GetValueTypeName(type);
      LogWrite(Info,"%s %i %s",_Var3._M_p,(ulong)uVar2,pcVar4);
LAB_00106ef1:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&count);
    }
    LogWrite(Info,"\n");
  } while( true );
}

Assistant:

inline_t void Runtime::LogBytecode(const Parser & parser) const
	{
		LogWriteLine(LogLevel::Info, "\nBytecode:\n====================");
		const size_t columnWidth = 16;
		auto buffer = parser.GetBytecode();
		BinaryReader reader(buffer);
		BytecodeHeader header;
		reader.Read(&header, sizeof(header));
		String scriptName;
		reader.Read(&scriptName);
		int instructionCount = 0;
		while (reader.Tell() < header.dataSize + sizeof(header))
		{
			// Read opcode instruction
			uint8_t opByte;
			reader.Read(&opByte);
			if (opByte >= static_cast<uint32_t>(Opcode::NumOpcodes))
			{
				LogWriteLine(LogLevel::Error, "LogBytecode(): Invalid operation in bytecode");
				return;
			}
			Opcode opcode = static_cast<Opcode>(opByte);

			++instructionCount;

			const char * opcodeName = GetOpcodeText(opcode);
			size_t opcodeNameLength = strlen(opcodeName);
			LogWrite(LogLevel::Info, opcodeName);

			// Advance to column offset
			assert(opcodeNameLength < columnWidth);
			for (size_t i = 0; i < (columnWidth - opcodeNameLength); ++i)
				LogWrite(LogLevel::Info, " ");

			// Read and log opcode arguments
			switch (opcode)
			{
				case Opcode::CallFunc:
				case Opcode::EraseItr:
				case Opcode::PushProp:
				case Opcode::PushVar:
				case Opcode::SetProp:
				case Opcode::SetVar:
				{
					RuntimeID id;
					reader.Read(&id);
					LogWrite(LogLevel::Info, "%s", parser.GetNameFromID(id).c_str());
				}
				break;
				case Opcode::ErasePropKeyVal:
				case Opcode::EraseVarKeyVal:
				case Opcode::SetPropKeyVal:
				case Opcode::SetVarKeyVal:
				{
					uint32_t subscripts;
					reader.Read(&subscripts);
					RuntimeID id;
					reader.Read(&id);
					LogWrite(LogLevel::Info, "%i %s, %s", subscripts, subscripts == 1 ? "subscript" : "subscripts", parser.GetNameFromID(id).c_str());
				}
				break;
				case Opcode::Cast:
				{
					uint8_t b;
					reader.Read(&b);
					auto type = ByteToValueType(b);
					LogWrite(LogLevel::Info, "%s", GetValueTypeName(type));
				}
				break;
				case Opcode::Function:
				{
					FunctionSignature signature;
					signature.Read(reader);
					LogWrite(LogLevel::Info, "%s", parser.GetNameFromID(signature.GetId()).c_str());
				}
				break;
				case Opcode::Library:
				{
					String name;
					reader.Read(&name);
					LogWrite(LogLevel::Info, "%s", name.c_str());
				}
				break;
				case Opcode::Property:
				{
					PropertyName propertyName;
					propertyName.Read(reader);
				}
				break;
				case Opcode::Jump:
				case Opcode::JumpFalse:
				case Opcode::JumpFalseCheck:
				case Opcode::JumpTrue:
				case Opcode::JumpTrueCheck:
				case Opcode::PopCount:
				case Opcode::PushColl:
				case Opcode::PushList:
				{
					uint32_t count;
					reader.Read(&count);
					LogWrite(LogLevel::Info, "%i", count);
				}
				break;
				case Opcode::PushVal:
				{
					Variant val;
					val.Read(reader);
					if (val.IsString())
						LogWrite(LogLevel::Info, "\"%s\"", val.GetString().c_str());
					else if (val.IsFunction())
						LogWrite(LogLevel::Info, "%s", parser.GetNameFromID(val.GetFunction()).c_str());
					else
						LogWrite(LogLevel::Info, "%s", val.GetString().c_str());
				}
				break;
				case Opcode::SetIndex:
				{
					RuntimeID id;
					reader.Read(&id);
					int32_t stackIndex;
					reader.Read(&stackIndex);
					ValueType type;
					reader.Read<ValueType, uint8_t>(&type);
					LogWrite(LogLevel::Info, "%s %i %s", parser.GetNameFromID(id).c_str(), stackIndex, GetValueTypeName(type));
				}
				break;
				default:
				{
				}
				break;
			}
			LogWrite(LogLevel::Info, "\n");
		}
		LogWrite(LogLevel::Info, "\nInstruction Count: %i\n\n", instructionCount);
	}